

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

size_t __thiscall
CoreML::Specification::FillLikeLayerParams::ByteSizeLong(FillLikeLayerParams *this)

{
  uint uVar1;
  
  uVar1 = -(uint)(this->value_ != 0.0) & 1;
  this->_cached_size_ = uVar1 * 5;
  return (ulong)uVar1 * 5;
}

Assistant:

size_t FillLikeLayerParams::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.FillLikeLayerParams)
  size_t total_size = 0;

  // float value = 1;
  if (this->value() != 0) {
    total_size += 1 + 4;
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}